

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_binary_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uchar *value,
                       uint32_t length,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000081;
  char *pcVar4;
  uchar local_2d;
  uchar local_2c;
  uchar local_2b;
  uchar local_2a;
  uchar local_29;
  
  if ((int)CONCAT71(in_register_00000081,use_smallest) == 0) {
    local_2b = (uchar)(length >> 0x18);
    iVar1 = (*encoder_output)(context,&local_2b,1);
    if (iVar1 == 0) {
      local_2a = (uchar)(length >> 0x10);
      iVar1 = (*encoder_output)(context,&local_2a,1);
      if (iVar1 == 0) {
        local_2d = (uchar)(length >> 8);
        iVar1 = (*encoder_output)(context,&local_2d,1);
        if (((iVar1 == 0) &&
            (local_29 = (uchar)length, iVar1 = (*encoder_output)(context,&local_29,1), iVar1 == 0))
           && (iVar1 = (*encoder_output)(context,value,(ulong)length), iVar1 == 0)) {
          return 0;
        }
      }
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xd85;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xd85;
    }
    pcVar4 = "Failed encoding large binary value";
    iVar3 = 0xd84;
  }
  else {
    local_2c = (uchar)length;
    iVar1 = (*encoder_output)(context,&local_2c,1);
    if (iVar1 == 0) {
      if (length == 0) {
        return 0;
      }
      iVar1 = (*encoder_output)(context,value,(ulong)length);
      if (iVar1 == 0) {
        return 0;
      }
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xd72;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xd72;
    }
    pcVar4 = "Failed encoding small binary value";
    iVar3 = 0xd71;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"encode_binary_value",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_binary_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const unsigned char* value, uint32_t length, bool use_smallest)
{
    int result;
    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_297: [<encoding name="vbin8" code="0xa0" category="variable" width="1" label="up to 2^8 - 1 octets of binary data"/>] */
        if ((output_byte(encoder_output, context, (unsigned char)length) != 0) ||
            ((length > 0) && (output_bytes(encoder_output, context, value, length) != 0)))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small binary value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_298: [<encoding name="vbin32" code="0xb0" category="variable" width="4" label="up to 2^32 - 1 octets of binary data"/>] */
        if ((output_byte(encoder_output, context, (length >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, length & 0xFF) != 0) ||
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large binary value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}